

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O0

ostream * vk::operator<<(ostream *str,DebugReportMessage *message)

{
  Bitfield<32UL> decoder;
  ostream *poVar1;
  ulong uVar2;
  Enum<vk::VkDebugReportObjectTypeEXT,_4UL> EVar3;
  Enum<vk::VkDebugReportObjectTypeEXT,_4UL> local_48;
  deUint64 local_38;
  Bitfield<32UL> local_30;
  DebugReportMessage *local_18;
  DebugReportMessage *message_local;
  ostream *str_local;
  
  local_18 = message;
  message_local = (DebugReportMessage *)str;
  anon_unknown_0::shortDebugFlagsStr(&local_30,message->flags);
  decoder.m_begin = local_30.m_begin;
  decoder.m_value = local_30.m_value;
  decoder.m_end = local_30.m_end;
  poVar1 = tcu::Format::operator<<(str,decoder);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)&local_18->message);
  poVar1 = std::operator<<(poVar1," (code ");
  local_38 = (deUint64)tcu::toHex<int>(local_18->messageCode);
  tcu::Format::operator<<(poVar1,(Hex<8UL>)local_38);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar1 = std::operator<<((ostream *)message_local," from ");
    std::operator<<(poVar1,(string *)&local_18->layerPrefix);
  }
  poVar1 = std::operator<<((ostream *)message_local," at ");
  EVar3 = anon_unknown_0::shortObjectTypeStr(local_18->objectType);
  local_48.m_getName = EVar3.m_getName;
  local_48.m_value = EVar3.m_value;
  poVar1 = tcu::Format::operator<<(poVar1,&local_48);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->location);
  std::operator<<(poVar1,")");
  return (ostream *)message_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DebugReportMessage& message)
{
	str << shortDebugFlagsStr(message.flags) << ": "
		<< message.message
		<< " (code " << tcu::toHex(message.messageCode);

	if (!message.layerPrefix.empty())
		str << " from " << message.layerPrefix;

	str << " at " << shortObjectTypeStr(message.objectType) << ":" << message.location << ")";

	return str;
}